

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O2

value_type_conflict7 * __thiscall
poplar::compact_fkhash_nlm<int,_64UL>::append(compact_fkhash_nlm<int,_64UL> *this,char_range *key)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__result;
  ulong uVar1;
  ulong in_RAX;
  uint8_t *puVar2;
  long lVar3;
  bool bVar4;
  undefined8 uStack_28;
  
  uVar1 = this->size_;
  this->size_ = uVar1 + 1;
  uStack_28 = in_RAX;
  if ((uVar1 & 0x3f) == 0 && 0x3f < uVar1) {
    release_buf_(this);
  }
  __result = &this->chunk_buf_;
  puVar2 = (uint8_t *)0x0;
  if (key->begin != key->end) {
    puVar2 = key->end + ~(ulong)key->begin;
  }
  vbyte::append(__result,(uint64_t)(puVar2 + 4));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (key->begin,puVar2 + (long)key->begin,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             __result);
  lVar3 = 4;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<char>
              (__result,(char *)((long)&uStack_28 + 7));
  }
  return (value_type_conflict7 *)
         ((this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish + -4);
}

Assistant:

value_type* append(const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(size_++);
        if (chunk_id != 0 && pos_in_chunk == 0) {
            release_buf_();
        }

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        uint64_t length = key.empty() ? 0 : key.length() - 1;
        vbyte::append(chunk_buf_, length + sizeof(value_type));
        std::copy(key.begin, key.begin + length, std::back_inserter(chunk_buf_));
        for (size_t i = 0; i < sizeof(value_type); ++i) {
            chunk_buf_.emplace_back('\0');
        }

        return reinterpret_cast<value_type*>(chunk_buf_.data() + chunk_buf_.size() - sizeof(value_type));
    }